

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_hair(SemanticParser *this,SP *in)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar5;
  SP SVar6;
  SP mat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::HairMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  lVar1 = *in_RDX;
  p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
  do {
    _Var2._M_pi = mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (p_Var4 == (_Rb_tree_node_base *)(lVar1 + 8)) {
      mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var4 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar3 = std::operator==(&name,"eumelanin");
    if (bVar3) {
      fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
      (mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->eumelanin =
           fVar5;
    }
    else {
      bVar3 = std::operator==(&name,"alpha");
      if (bVar3) {
        fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
        (mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alpha =
             fVar5;
      }
      else {
        bVar3 = std::operator==(&name,"beta_m");
        if (bVar3) {
          fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
          (mat.super___shared_ptr<pbrt::HairMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->beta_m =
               fVar5;
        }
        else {
          bVar3 = std::operator==(&name,"type");
          if (!bVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_c0,"as-yet-unhandled hair-material parameter \'",&it.first);
            std::operator+(&local_a0,&local_c0,"\'");
            std::runtime_error::runtime_error(this_00,(string *)&local_a0);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_hair(pbrt::syntactic::Material::SP in)
  {
    HairMaterial::SP mat = std::make_shared<HairMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "eumelanin") {
        mat->eumelanin = in->getParam1f(name);
      } else if (name == "alpha") {
        mat->alpha = in->getParam1f(name);
      } else if (name == "beta_m") {
        mat->beta_m = in->getParam1f(name);
      } else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("as-yet-unhandled hair-material parameter '"+it.first+"'");
    };
    return mat;
  }